

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

SplitLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_split(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x14a) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x14a;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    SplitLayerParams::SplitLayerParams(this_00.split_);
    (this->layer_).split_ = (SplitLayerParams *)this_00;
  }
  return (SplitLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::SplitLayerParams* NeuralNetworkLayer::mutable_split() {
  if (!has_split()) {
    clear_layer();
    set_has_split();
    layer_.split_ = new ::CoreML::Specification::SplitLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.split)
  return layer_.split_;
}